

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  _Alloc_hider _Var4;
  SystemInformationImplementation *pSVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  FILE *__stream;
  long lVar9;
  ulonglong uVar10;
  long *plVar11;
  long *plVar12;
  undefined8 *puVar13;
  char *__nptr;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  undefined1 *puStack_3c0;
  long lStack_3b8;
  undefined1 uStack_3b0;
  undefined7 uStack_3af;
  string sStack_3a0;
  string sStack_380;
  SystemInformationImplementation *pSStack_360;
  string sStack_358;
  string sStack_338;
  undefined8 *puStack_318;
  undefined8 *puStack_310;
  long lStack_308;
  string sStack_300;
  string sStack_2e0;
  string sStack_2c0;
  string sStack_2a0;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  string sStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_a0;
  long *plStack_80;
  long lStack_78;
  long lStack_70;
  long lStack_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_60;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_3c0 = &uStack_3b0;
  lStack_3b8 = 0;
  uStack_3b0 = 0;
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Problem opening /proc/cpuinfo\n",0x1e);
    goto LAB_00672d20;
  }
  iVar7 = feof(__stream);
  uVar15 = 0;
  if (iVar7 == 0) {
    do {
      fgetc(__stream);
      std::__cxx11::string::push_back((char)&puStack_3c0);
      uVar15 = uVar15 + 1;
      iVar7 = feof(__stream);
    } while (iVar7 == 0);
  }
  fclose(__stream);
  if (uVar15 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No data in /proc/cpuinfo\n",0x19);
    goto LAB_00672d20;
  }
  std::__cxx11::string::resize((ulong)&puStack_3c0,(char)uVar15 + -2);
  lVar9 = std::__cxx11::string::find((char *)&puStack_3c0,0x8ff4ee,0);
  if (lVar9 != -1) {
    do {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      lVar9 = std::__cxx11::string::find((char *)&puStack_3c0,0x8ff4ee,lVar9 + 1);
    } while (lVar9 != -1);
  }
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_60._M_impl.super__Rb_tree_header._M_header;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  sStack_e0._M_dataplus._M_p = (pointer)&sStack_e0.field_2;
  _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_e0,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_c0,this,&sStack_e0,"physical id",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
    operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
  }
  pSStack_360 = this;
  if (this->CurrentPositionInFile != 0xffffffffffffffff) {
    do {
      sStack_338._M_dataplus._M_p._0_4_ = atoi(sStack_c0._M_dataplus._M_p);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &_Stack_60,(int *)&sStack_338);
      sStack_100._M_dataplus._M_p = (pointer)&sStack_100.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_100,puStack_3c0,puStack_3c0 + lStack_3b8);
      ExtractValueFromCpuInfoFile
                (&sStack_300,pSStack_360,&sStack_100,"physical id",
                 pSStack_360->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)&sStack_c0,(string *)&sStack_300);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_300._M_dataplus._M_p != &sStack_300.field_2) {
        operator_delete(sStack_300._M_dataplus._M_p,sStack_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_100._M_dataplus._M_p != &sStack_100.field_2) {
        operator_delete(sStack_100._M_dataplus._M_p,sStack_100.field_2._M_allocated_capacity + 1);
      }
    } while (pSStack_360->CurrentPositionInFile != 0xffffffffffffffff);
  }
  bVar16 = _Stack_60._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar7 = (int)_Stack_60._M_impl.super__Rb_tree_header._M_node_count;
  sStack_120._M_dataplus._M_p = (pointer)&sStack_120.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_120,puStack_3c0,puStack_3c0 + lStack_3b8);
  pSVar5 = pSStack_360;
  ExtractValueFromCpuInfoFile(&sStack_300,pSStack_360,&sStack_120,"cpu cores",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_120._M_dataplus._M_p != &sStack_120.field_2) {
    operator_delete(sStack_120._M_dataplus._M_p,sStack_120.field_2._M_allocated_capacity + 1);
  }
  if (sStack_300._M_string_length == 0) {
    sStack_140._M_dataplus._M_p = (pointer)&sStack_140.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_140,puStack_3c0,puStack_3c0 + lStack_3b8);
    ExtractValueFromCpuInfoFile(&sStack_338,pSVar5,&sStack_140,"ncpus probed",0);
    std::__cxx11::string::operator=((string *)&sStack_300,(string *)&sStack_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p) !=
        &sStack_338.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p),
                      sStack_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_140._M_dataplus._M_p != &sStack_140.field_2) {
      operator_delete(sStack_140._M_dataplus._M_p,sStack_140.field_2._M_allocated_capacity + 1);
    }
  }
  iVar8 = atoi(sStack_300._M_dataplus._M_p);
  iVar7 = (iVar7 + (uint)bVar16) * (iVar8 + (uint)(iVar8 == 0));
  uVar14 = iVar7 + (uint)(iVar7 == 0);
  pSVar5->NumberOfPhysicalCPU = uVar14;
  if (pSVar5->NumberOfLogicalCPU == 0) {
    pSVar5->NumberOfLogicalCPU = uVar14;
  }
  (pSVar5->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       pSVar5->NumberOfLogicalCPU / uVar14;
  sStack_160._M_dataplus._M_p = (pointer)&sStack_160.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_160,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_338,pSVar5,&sStack_160,"cpu MHz",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_160._M_dataplus._M_p != &sStack_160.field_2) {
    operator_delete(sStack_160._M_dataplus._M_p,sStack_160.field_2._M_allocated_capacity + 1);
  }
  if (sStack_338._M_string_length == 0) {
    sStack_180._M_dataplus._M_p = (pointer)&sStack_180.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_180,puStack_3c0,puStack_3c0 + lStack_3b8);
    ExtractValueFromCpuInfoFile(&sStack_358,pSVar5,&sStack_180,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_338,(string *)&sStack_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_358._M_dataplus._M_p != &sStack_358.field_2) {
      operator_delete(sStack_358._M_dataplus._M_p,sStack_358.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_180._M_dataplus._M_p != &sStack_180.field_2) {
      operator_delete(sStack_180._M_dataplus._M_p,sStack_180.field_2._M_allocated_capacity + 1);
    }
    if (sStack_338._M_string_length == 0) {
      sStack_1a0._M_dataplus._M_p = (pointer)&sStack_1a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_1a0,puStack_3c0,puStack_3c0 + lStack_3b8);
      ExtractValueFromCpuInfoFile(&sStack_358,pSVar5,&sStack_1a0,"CPU0ClkTck",0);
      std::__cxx11::string::operator=((string *)&sStack_338,(string *)&sStack_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_358._M_dataplus._M_p != &sStack_358.field_2) {
        operator_delete(sStack_358._M_dataplus._M_p,sStack_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_1a0._M_dataplus._M_p != &sStack_1a0.field_2) {
        operator_delete(sStack_1a0._M_dataplus._M_p,sStack_1a0.field_2._M_allocated_capacity + 1);
      }
      __nptr = (char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p);
      iVar7 = 10;
    }
    else {
      __nptr = (char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p);
      iVar7 = 0x10;
    }
    uVar10 = strtoull(__nptr,(char **)0x0,iVar7);
    fVar17 = (float)uVar10 / 1e+06;
  }
  else {
    dVar3 = atof((char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p
                                 ));
    fVar17 = (float)dVar3;
  }
  pSVar5->CPUSpeedInMHz = fVar17;
  sStack_1c0._M_dataplus._M_p = (pointer)&sStack_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_1c0,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_358,pSVar5,&sStack_1c0,"cpu family",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1c0._M_dataplus._M_p != &sStack_1c0.field_2) {
    operator_delete(sStack_1c0._M_dataplus._M_p,sStack_1c0.field_2._M_allocated_capacity + 1);
  }
  if (sStack_358._M_string_length == 0) {
    sStack_1e0._M_dataplus._M_p = (pointer)&sStack_1e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_1e0,puStack_3c0,puStack_3c0 + lStack_3b8);
    ExtractValueFromCpuInfoFile(&sStack_380,pSVar5,&sStack_1e0,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_358,(string *)&sStack_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_380._M_dataplus._M_p != &sStack_380.field_2) {
      operator_delete(sStack_380._M_dataplus._M_p,sStack_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_1e0._M_dataplus._M_p != &sStack_1e0.field_2) {
      operator_delete(sStack_1e0._M_dataplus._M_p,sStack_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_358._M_dataplus._M_p);
  (pSVar5->ChipID).Family = iVar7;
  sStack_200._M_dataplus._M_p = (pointer)&sStack_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_200,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_380,pSVar5,&sStack_200,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).Vendor,(string *)&sStack_380);
  paVar2 = &sStack_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_380._M_dataplus._M_p != paVar2) {
    operator_delete(sStack_380._M_dataplus._M_p,sStack_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_200._M_dataplus._M_p != &sStack_200.field_2) {
    operator_delete(sStack_200._M_dataplus._M_p,sStack_200.field_2._M_allocated_capacity + 1);
  }
  FindManufacturer(pSVar5,&sStack_358);
  if (((pSVar5->ChipID).Family == 0) && (pSVar5->ChipManufacturer == HP)) {
    iVar7 = std::__cxx11::string::compare((char *)&sStack_358);
    if (iVar7 == 0) {
      iVar7 = 0x11a;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)&sStack_358);
      if (iVar7 != 0) goto LAB_0067255c;
      iVar7 = 0x200;
    }
    (pSVar5->ChipID).Family = iVar7;
  }
LAB_0067255c:
  sStack_220._M_dataplus._M_p = (pointer)&sStack_220.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_220,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_380,pSVar5,&sStack_220,"model",0);
  _Var4._M_p = sStack_380._M_dataplus._M_p;
  iVar7 = atoi(sStack_380._M_dataplus._M_p);
  (pSVar5->ChipID).Model = iVar7;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar2) {
    operator_delete(_Var4._M_p,sStack_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_220._M_dataplus._M_p != &sStack_220.field_2) {
    operator_delete(sStack_220._M_dataplus._M_p,sStack_220.field_2._M_allocated_capacity + 1);
  }
  bVar16 = RetrieveClassicalCPUIdentity(pSVar5);
  if (!bVar16) {
    sStack_240._M_dataplus._M_p = (pointer)&sStack_240.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_240,puStack_3c0,puStack_3c0 + lStack_3b8);
    ExtractValueFromCpuInfoFile(&sStack_380,pSVar5,&sStack_240,"cpu",0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_240._M_dataplus._M_p != &sStack_240.field_2) {
      operator_delete(sStack_240._M_dataplus._M_p,sStack_240.field_2._M_allocated_capacity + 1);
    }
    if (sStack_380._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(pSVar5->ChipID).ProcessorName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_380._M_dataplus._M_p != paVar2) {
      operator_delete(sStack_380._M_dataplus._M_p,sStack_380.field_2._M_allocated_capacity + 1);
    }
  }
  sStack_260._M_dataplus._M_p = (pointer)&sStack_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_260,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_380,pSVar5,&sStack_260,"stepping",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_260._M_dataplus._M_p != &sStack_260.field_2) {
    operator_delete(sStack_260._M_dataplus._M_p,sStack_260.field_2._M_allocated_capacity + 1);
  }
  if (sStack_380._M_string_length == 0) {
    sStack_280._M_dataplus._M_p = (pointer)&sStack_280.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_280,puStack_3c0,puStack_3c0 + lStack_3b8);
    ExtractValueFromCpuInfoFile(&sStack_3a0,pSVar5,&sStack_280,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_380,(string *)&sStack_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_3a0._M_dataplus._M_p != &sStack_3a0.field_2) {
      operator_delete(sStack_3a0._M_dataplus._M_p,sStack_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_280._M_dataplus._M_p != &sStack_280.field_2) {
      operator_delete(sStack_280._M_dataplus._M_p,sStack_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = atoi(sStack_380._M_dataplus._M_p);
  (pSVar5->ChipID).Revision = iVar7;
  sStack_2a0._M_dataplus._M_p = (pointer)&sStack_2a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_2a0,puStack_3c0,puStack_3c0 + lStack_3b8);
  ExtractValueFromCpuInfoFile(&sStack_3a0,pSVar5,&sStack_2a0,"model name",0);
  std::__cxx11::string::operator=((string *)&(pSVar5->ChipID).ModelName,(string *)&sStack_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3a0._M_dataplus._M_p != &sStack_3a0.field_2) {
    operator_delete(sStack_3a0._M_dataplus._M_p,sStack_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2a0._M_dataplus._M_p != &sStack_2a0.field_2) {
    operator_delete(sStack_2a0._M_dataplus._M_p,sStack_2a0.field_2._M_allocated_capacity + 1);
  }
  puStack_318 = (undefined8 *)0x0;
  lStack_308 = 0;
  puStack_310 = (undefined8 *)0x0;
  sStack_3a0._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_318,(char **)&sStack_3a0);
  sStack_3a0._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_318,(char **)&sStack_3a0);
  sStack_3a0._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&puStack_318,(char **)&sStack_3a0);
  puVar6 = puStack_310;
  (pSVar5->Features).L1CacheSize = 0;
  if (puStack_318 != puStack_310) {
    puVar13 = puStack_318;
    do {
      sStack_2c0._M_dataplus._M_p = (pointer)&sStack_2c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&sStack_2c0,puStack_3c0,puStack_3c0 + lStack_3b8);
      ExtractValueFromCpuInfoFile(&sStack_3a0,pSStack_360,&sStack_2c0,(char *)*puVar13,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_2c0._M_dataplus._M_p != &sStack_2c0.field_2) {
        operator_delete(sStack_2c0._M_dataplus._M_p,sStack_2c0.field_2._M_allocated_capacity + 1);
      }
      if (sStack_3a0._M_string_length != 0) {
        lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x9374fd,0);
        if (lVar9 != -1) {
          std::__cxx11::string::resize((ulong)&sStack_3a0,(char)lVar9);
        }
        iVar7 = atoi(sStack_3a0._M_dataplus._M_p);
        piVar1 = &(pSStack_360->Features).L1CacheSize;
        *piVar1 = *piVar1 + iVar7;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_3a0._M_dataplus._M_p != &sStack_3a0.field_2) {
        operator_delete(sStack_3a0._M_dataplus._M_p,sStack_3a0.field_2._M_allocated_capacity + 1);
      }
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar6);
  }
  sStack_2e0._M_dataplus._M_p = (pointer)&sStack_2e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_2e0,puStack_3c0,puStack_3c0 + lStack_3b8);
  pSVar5 = pSStack_360;
  ExtractValueFromCpuInfoFile(&sStack_3a0,pSStack_360,&sStack_2e0,"flags",0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_2e0._M_dataplus._M_p != &sStack_2e0.field_2) {
    operator_delete(sStack_2e0._M_dataplus._M_p,sStack_2e0.field_2._M_allocated_capacity + 1);
  }
  if (sStack_380._M_string_length != 0) {
    std::operator+(&bStack_a0," ",&sStack_3a0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&bStack_a0);
    plVar12 = plVar11 + 2;
    if ((long *)*plVar11 == plVar12) {
      lStack_70 = *plVar12;
      lStack_68 = plVar11[3];
      plStack_80 = &lStack_70;
    }
    else {
      lStack_70 = *plVar12;
      plStack_80 = (long *)*plVar11;
    }
    lStack_78 = plVar11[1];
    *plVar11 = (long)plVar12;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&sStack_3a0,(string *)&plStack_80);
    if (plStack_80 != &lStack_70) {
      operator_delete(plStack_80,lStack_70 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)bStack_a0._M_dataplus._M_p != &bStack_a0.field_2) {
      operator_delete(bStack_a0._M_dataplus._M_p,bStack_a0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5b9,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasFPU = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5bf,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasTSC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5c5,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMMX = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5cb,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5d1,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasSSE2 = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5d8,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasAPIC = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5df,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasCMOV = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5e6,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasMTRR = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5ed,0);
    if (lVar9 != -1) {
      (pSVar5->Features).HasACPI = true;
    }
    lVar9 = std::__cxx11::string::find((char *)&sStack_3a0,0x8ff5f4,0);
    if (lVar9 != -1) {
      (pSVar5->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_3a0._M_dataplus._M_p != &sStack_3a0.field_2) {
    operator_delete(sStack_3a0._M_dataplus._M_p,sStack_3a0.field_2._M_allocated_capacity + 1);
  }
  if (puStack_318 != (undefined8 *)0x0) {
    operator_delete(puStack_318,lStack_308 - (long)puStack_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_380._M_dataplus._M_p != &sStack_380.field_2) {
    operator_delete(sStack_380._M_dataplus._M_p,sStack_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_358._M_dataplus._M_p != &sStack_358.field_2) {
    operator_delete(sStack_358._M_dataplus._M_p,sStack_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p) !=
      &sStack_338.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p),
                    sStack_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_300._M_dataplus._M_p != &sStack_300.field_2) {
    operator_delete(sStack_300._M_dataplus._M_p,sStack_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_60);
LAB_00672d20:
  if (puStack_3c0 != &uStack_3b0) {
    operator_delete(puStack_3c0,CONCAT71(uStack_3af,uStack_3b0) + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetrieveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}